

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O3

void google::protobuf::swap(FieldOptions_EditionDefault *a,FieldOptions_EditionDefault *b)

{
  uint32_t uVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (b == a) {
    return;
  }
  uVar6 = (a->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    uVar6 = *(ulong *)(uVar6 & 0xfffffffffffffffe);
  }
  uVar5 = (b->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
  }
  if (uVar6 != uVar5) {
    internal::GenericSwap(&a->super_Message,&b->super_Message);
    return;
  }
  uVar6 = (a->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar5 = uVar6;
  if ((uVar6 & 1) != 0) {
    uVar5 = *(ulong *)(uVar6 & 0xfffffffffffffffe);
  }
  uVar3 = (b->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar7 = uVar3;
  if ((uVar3 & 1) != 0) {
    uVar7 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
  }
  if (uVar5 == uVar7) {
    (a->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar3;
    (b->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar6;
    uVar1 = (a->field_0)._impl_._has_bits_.has_bits_[0];
    (a->field_0)._impl_._has_bits_.has_bits_[0] = (b->field_0)._impl_._has_bits_.has_bits_[0];
    (b->field_0)._impl_._has_bits_.has_bits_[0] = uVar1;
    pvVar4 = (b->field_0)._impl_.value_.tagged_ptr_.ptr_;
    (b->field_0)._impl_.value_.tagged_ptr_.ptr_ = (a->field_0)._impl_.value_.tagged_ptr_.ptr_;
    (a->field_0)._impl_.value_.tagged_ptr_.ptr_ = pvVar4;
    iVar2 = (a->field_0)._impl_.edition_;
    (a->field_0)._impl_.edition_ = (b->field_0)._impl_.edition_;
    (b->field_0)._impl_.edition_ = iVar2;
    return;
  }
  FieldOptions_EditionDefault::InternalSwap();
}

Assistant:

friend void swap(FieldOptions_EditionDefault& a, FieldOptions_EditionDefault& b) { a.Swap(&b); }